

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

bool __thiscall ON_PolyCurve::Extend(ON_PolyCurve *this,ON_Interval *domain)

{
  ON_Curve *pOVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  double *pdVar5;
  uint segment_index;
  double extraout_XMM0_Qa;
  double dVar6;
  double dVar7;
  double extraout_XMM0_Qa_00;
  double in_XMM1_Qa;
  ON_Interval sdom;
  ON_Interval local_60;
  ON_Interval DesiredDom;
  ON_Interval cdom;
  
  iVar4 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x34])();
  if ((char)iVar4 != '\0') {
    return false;
  }
  if ((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count < 1) {
    return false;
  }
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
  sdom.m_t[1] = in_XMM1_Qa;
  sdom.m_t[0] = extraout_XMM0_Qa;
  cVar2 = '\0';
  pdVar5 = ON_Interval::operator[](&sdom,0);
  dVar7 = *pdVar5;
  dVar6 = ON_Interval::operator[](domain,0);
  if (dVar6 < dVar7) {
    if ((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count < 1) {
      return false;
    }
    pOVar1 = *(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
    if (pOVar1 == (ON_Curve *)0x0) {
      return false;
    }
    sdom = SegmentDomain(this,0);
    dVar7 = sdom.m_t[1];
    (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar1);
    cdom.m_t[1] = dVar7;
    dVar7 = ON_Interval::operator[](domain,0);
    dVar6 = ON_Interval::TransformParameterTo(&sdom,&cdom,dVar7);
    pdVar5 = ON_Interval::operator[](&cdom,1);
    dVar7 = *pdVar5;
    ON_Interval::ON_Interval(&DesiredDom,dVar6,dVar7);
    iVar4 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3d])(pOVar1,&DesiredDom)
    ;
    cVar2 = (char)iVar4;
    if (cVar2 != '\0') {
      (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar1);
      local_60.m_t[1] = dVar7;
      bVar3 = ON_Interval::operator==(&local_60,&DesiredDom);
      if (bVar3) {
        dVar6 = ON_Interval::operator[](domain,0);
      }
      else {
        (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar1);
        local_60.m_t[1] = dVar7;
        pdVar5 = ON_Interval::operator[](&local_60,0);
        dVar6 = ON_Interval::TransformParameterTo(&cdom,&sdom,*pdVar5);
      }
      *(this->m_t).m_a = dVar6;
    }
  }
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
  sdom.m_t[1] = dVar7;
  sdom.m_t[0] = extraout_XMM0_Qa_00;
  pdVar5 = ON_Interval::operator[](&sdom,1);
  dVar7 = *pdVar5;
  dVar6 = ON_Interval::operator[](domain,1);
  if (dVar7 < dVar6) {
    iVar4 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
    if (iVar4 < 1) {
      return false;
    }
    segment_index = iVar4 - 1;
    pOVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[segment_index];
    if (pOVar1 == (ON_Curve *)0x0) {
      return false;
    }
    sdom = SegmentDomain(this,segment_index);
    dVar7 = sdom.m_t[1];
    (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar1);
    cdom.m_t[1] = dVar7;
    dVar7 = ON_Interval::operator[](domain,1);
    dVar7 = ON_Interval::TransformParameterTo(&sdom,&cdom,dVar7);
    pdVar5 = ON_Interval::operator[](&cdom,0);
    ON_Interval::ON_Interval(&DesiredDom,*pdVar5,dVar7);
    iVar4 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3d])(pOVar1,&DesiredDom)
    ;
    if ((char)iVar4 != '\0') {
      (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar1);
      local_60.m_t[1] = dVar7;
      bVar3 = ON_Interval::operator==(&local_60,&DesiredDom);
      if (bVar3) {
        dVar7 = ON_Interval::operator[](domain,1);
      }
      else {
        (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar1);
        local_60.m_t[1] = dVar7;
        pdVar5 = ON_Interval::operator[](&local_60,1);
        dVar7 = ON_Interval::TransformParameterTo(&cdom,&sdom,*pdVar5);
      }
      (this->m_t).m_a[(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count] = dVar7;
      goto LAB_00598000;
    }
  }
  if (cVar2 == '\0') {
    return false;
  }
LAB_00598000:
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return true;
}

Assistant:

bool ON_PolyCurve::Extend(
  const ON_Interval& domain
  )
 
{
  if (IsClosed() || Count() < 1) return false;
 
  bool changed = false;
  if (Domain()[0] > domain[0]){
    ON_Curve* seg = SegmentCurve(0);
    if (!seg) return false;
    ON_Interval sdom = SegmentDomain(0);
    ON_Interval cdom = seg->Domain();
    double a = sdom.TransformParameterTo(cdom, domain[0]);
    ON_Interval DesiredDom(a, cdom[1]);
    changed = seg->Extend(DesiredDom);
    if (changed) {
      if (seg->Domain() == DesiredDom)
        m_t[0] = domain[0];
      else
        m_t[0] = cdom.TransformParameterTo(sdom, seg->Domain()[0]);
    }
  }
  if (Domain()[1] < domain[1]){
    bool chgd = false;
    ON_Curve* seg = SegmentCurve(Count()-1);
    if (!seg) return false;
    ON_Interval sdom = SegmentDomain(Count()-1);
    ON_Interval cdom = seg->Domain();
    double a = sdom.TransformParameterTo(cdom, domain[1]);
    ON_Interval DesiredDom(cdom[0], a);
    chgd = seg->Extend(DesiredDom);
    if (chgd) {
      if (seg->Domain() == DesiredDom)
        m_t[Count()] = domain[1];
      else
        m_t[Count()] = cdom.TransformParameterTo(sdom, seg->Domain()[1]);
      changed = true;
    }
  }
 
  if (changed){
    DestroyCurveTree();
  }
 
  return changed;
}